

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystementry_p.h
# Opt level: O2

void __thiscall QFileSystemEntry::clear(QFileSystemEntry *this)

{
  long in_FS_OFFSET;
  QFileSystemEntry local_50;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QFileSystemEntry(&local_50);
  operator=(this,&local_50);
  ~QFileSystemEntry(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void clear()
    {
        *this = QFileSystemEntry();
    }